

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O2

ByteData256 * __thiscall
cfd::core::TapBranch::GetBaseHash(ByteData256 *__return_storage_ptr__,TapBranch *this)

{
  int iVar1;
  HashUtil *pHVar2;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_88;
  HashUtil local_70;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  if (this->has_leaf_ == false) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&__return_storage_ptr__->data_,&(this->root_commitment_).data_);
  }
  else {
    if (GetBaseHash()::kTaggedHash == '\0') {
      iVar1 = __cxa_guard_acquire(&GetBaseHash()::kTaggedHash);
      if (iVar1 != 0) {
        ::std::__cxx11::string::string((string *)&local_70,"TapLeaf",(allocator *)&_Stack_88);
        HashUtil::Sha256(&GetBaseHash::kTaggedHash,(string *)&local_70);
        ::std::__cxx11::string::~string((string *)&local_70);
        __cxa_atexit(ByteData256::~ByteData256,&GetBaseHash::kTaggedHash,&__dso_handle);
        __cxa_guard_release(&GetBaseHash()::kTaggedHash);
      }
    }
    HashUtil::HashUtil(&local_70,'\x03');
    pHVar2 = HashUtil::operator<<(&local_70,&GetBaseHash::kTaggedHash);
    pHVar2 = HashUtil::operator<<(pHVar2,&GetBaseHash::kTaggedHash);
    ByteData::ByteData((ByteData *)&_Stack_88,this->leaf_version_);
    pHVar2 = HashUtil::operator<<(pHVar2,(ByteData *)&_Stack_88);
    Script::GetData((ByteData *)&local_48,&this->script_);
    ByteData::Serialize((ByteData *)&local_30,(ByteData *)&local_48);
    pHVar2 = HashUtil::operator<<(pHVar2,(ByteData *)&local_30);
    HashUtil::Output256(__return_storage_ptr__,pHVar2);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_88);
    HashUtil::~HashUtil(&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData256 TapBranch::GetBaseHash() const {
  if (!has_leaf_) return root_commitment_;

  static auto kTaggedHash = HashUtil::Sha256("TapLeaf");
  return (HashUtil(HashUtil::kSha256)
          << kTaggedHash << kTaggedHash << ByteData(leaf_version_)
          << script_.GetData().Serialize())
      .Output256();
}